

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

size_t ZSTD_HcFindBestMatch_selectMLS(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iLimit,size_t *offsetPtr)

{
  uint uVar1;
  U32 *pUVar2;
  BYTE *pBVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  BYTE *pBVar7;
  uint local_338;
  uint local_320;
  uint local_308;
  size_t *offsetPtr_local;
  BYTE *iLimit_local;
  BYTE *ip_local;
  ZSTD_matchState_t *ms_local;
  BYTE *match_8;
  size_t currentMl_5;
  U32 dmsMinChain_2;
  U32 dmsIndexDelta_2;
  U32 dmsSize_2;
  BYTE *dmsEnd_2;
  BYTE *dmsBase_2;
  U32 dmsLowestIndex_2;
  U32 dmsChainMask_2;
  U32 dmsChainSize_2;
  U32 *dmsChainTable_2;
  ZSTD_matchState_t *dms_2;
  BYTE *match_7;
  BYTE *match_6;
  size_t currentMl_4;
  BYTE *pBStack_268;
  U32 matchIndex_2;
  size_t ml_2;
  U32 nbAttempts_2;
  U32 minChain_2;
  U32 current_2;
  U32 lowLimit_2;
  BYTE *dictEnd_2;
  BYTE *prefixStart_2;
  U32 dictLimit_2;
  BYTE *dictBase_2;
  BYTE *base_2;
  U32 chainMask_2;
  U32 chainSize_2;
  U32 *chainTable_2;
  ZSTD_compressionParameters *cParams_2;
  BYTE *match_5;
  size_t currentMl_3;
  U32 dmsMinChain_1;
  U32 dmsIndexDelta_1;
  U32 dmsSize_1;
  BYTE *dmsEnd_1;
  BYTE *dmsBase_1;
  U32 dmsLowestIndex_1;
  U32 dmsChainMask_1;
  U32 dmsChainSize_1;
  U32 *dmsChainTable_1;
  ZSTD_matchState_t *dms_1;
  BYTE *match_4;
  BYTE *match_3;
  size_t currentMl_2;
  BYTE *pBStack_178;
  U32 matchIndex_1;
  size_t ml_1;
  U32 nbAttempts_1;
  U32 minChain_1;
  U32 current_1;
  U32 lowLimit_1;
  BYTE *dictEnd_1;
  BYTE *prefixStart_1;
  U32 dictLimit_1;
  BYTE *dictBase_1;
  BYTE *base_1;
  U32 chainMask_1;
  U32 chainSize_1;
  U32 *chainTable_1;
  ZSTD_compressionParameters *cParams_1;
  BYTE *match_2;
  size_t currentMl_1;
  U32 dmsMinChain;
  U32 dmsIndexDelta;
  U32 dmsSize;
  BYTE *dmsEnd;
  BYTE *dmsBase;
  U32 dmsLowestIndex;
  U32 dmsChainMask;
  U32 dmsChainSize;
  U32 *dmsChainTable;
  ZSTD_matchState_t *dms;
  BYTE *match_1;
  BYTE *match;
  size_t currentMl;
  BYTE *pBStack_88;
  U32 matchIndex;
  size_t ml;
  U32 nbAttempts;
  U32 minChain;
  U32 current;
  U32 lowLimit;
  BYTE *dictEnd;
  BYTE *prefixStart;
  U32 dictLimit;
  BYTE *dictBase;
  BYTE *base;
  U32 chainMask;
  U32 chainSize;
  U32 *chainTable;
  ZSTD_compressionParameters *cParams;
  
  uVar1 = (ms->cParams).minMatch;
  iVar4 = (int)ip;
  if (uVar1 != 4) {
    if (uVar1 == 5) {
      pUVar2 = ms->chainTable;
      uVar5 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
      pBVar3 = (ms->window).base;
      uVar1 = (ms->window).lowLimit;
      uVar6 = iVar4 - (int)pBVar3;
      if (uVar5 < uVar6) {
        local_320 = uVar6 - uVar5;
      }
      else {
        local_320 = 0;
      }
      ml_1._0_4_ = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      pBStack_178 = (BYTE *)0x3;
      currentMl_2._4_4_ = ZSTD_insertAndFindFirstIndex_internal(ms,&ms->cParams,ip,5);
      while( true ) {
        if (currentMl_2._4_4_ <= uVar1 || (int)ml_1 == 0) {
          return (size_t)pBStack_178;
        }
        match_3 = (BYTE *)0x0;
        pBVar7 = pBVar3 + currentMl_2._4_4_;
        if (pBVar7[(long)pBStack_178] == ip[(long)pBStack_178]) {
          match_3 = (BYTE *)ZSTD_count(ip,pBVar7,iLimit);
        }
        if (pBStack_178 < match_3) {
          pBStack_178 = match_3;
          *offsetPtr = (ulong)((uVar6 - currentMl_2._4_4_) + 2);
          if (ip + (long)match_3 == iLimit) {
            return (size_t)match_3;
          }
        }
        if (currentMl_2._4_4_ <= local_320) break;
        currentMl_2._4_4_ = pUVar2[currentMl_2._4_4_ & uVar5 - 1];
        ml_1._0_4_ = (int)ml_1 + -1;
      }
      return (size_t)pBStack_178;
    }
    if (uVar1 - 6 < 2) {
      pUVar2 = ms->chainTable;
      uVar5 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
      pBVar3 = (ms->window).base;
      uVar1 = (ms->window).lowLimit;
      uVar6 = iVar4 - (int)pBVar3;
      if (uVar5 < uVar6) {
        local_338 = uVar6 - uVar5;
      }
      else {
        local_338 = 0;
      }
      ml_2._0_4_ = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      pBStack_268 = (BYTE *)0x3;
      currentMl_4._4_4_ = ZSTD_insertAndFindFirstIndex_internal(ms,&ms->cParams,ip,6);
      while( true ) {
        if (currentMl_4._4_4_ <= uVar1 || (int)ml_2 == 0) {
          return (size_t)pBStack_268;
        }
        match_6 = (BYTE *)0x0;
        pBVar7 = pBVar3 + currentMl_4._4_4_;
        if (pBVar7[(long)pBStack_268] == ip[(long)pBStack_268]) {
          match_6 = (BYTE *)ZSTD_count(ip,pBVar7,iLimit);
        }
        if (pBStack_268 < match_6) {
          pBStack_268 = match_6;
          *offsetPtr = (ulong)((uVar6 - currentMl_4._4_4_) + 2);
          if (ip + (long)match_6 == iLimit) {
            return (size_t)match_6;
          }
        }
        if (currentMl_4._4_4_ <= local_338) break;
        currentMl_4._4_4_ = pUVar2[currentMl_4._4_4_ & uVar5 - 1];
        ml_2._0_4_ = (int)ml_2 + -1;
      }
      return (size_t)pBStack_268;
    }
  }
  pUVar2 = ms->chainTable;
  uVar5 = 1 << ((byte)(ms->cParams).chainLog & 0x1f);
  pBVar3 = (ms->window).base;
  uVar1 = (ms->window).lowLimit;
  uVar6 = iVar4 - (int)pBVar3;
  if (uVar5 < uVar6) {
    local_308 = uVar6 - uVar5;
  }
  else {
    local_308 = 0;
  }
  ml._0_4_ = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  pBStack_88 = (BYTE *)0x3;
  currentMl._4_4_ = ZSTD_insertAndFindFirstIndex_internal(ms,&ms->cParams,ip,4);
  while( true ) {
    if (currentMl._4_4_ <= uVar1 || (int)ml == 0) {
      return (size_t)pBStack_88;
    }
    match = (BYTE *)0x0;
    pBVar7 = pBVar3 + currentMl._4_4_;
    if (pBVar7[(long)pBStack_88] == ip[(long)pBStack_88]) {
      match = (BYTE *)ZSTD_count(ip,pBVar7,iLimit);
    }
    if (pBStack_88 < match) {
      pBStack_88 = match;
      *offsetPtr = (ulong)((uVar6 - currentMl._4_4_) + 2);
      if (ip + (long)match == iLimit) {
        return (size_t)match;
      }
    }
    if (currentMl._4_4_ <= local_308) break;
    currentMl._4_4_ = pUVar2[currentMl._4_4_ & uVar5 - 1];
    ml._0_4_ = (int)ml + -1;
  }
  return (size_t)pBStack_88;
}

Assistant:

FORCE_INLINE_TEMPLATE size_t ZSTD_HcFindBestMatch_selectMLS (
                        ZSTD_matchState_t* ms,
                        const BYTE* ip, const BYTE* const iLimit,
                        size_t* offsetPtr)
{
    switch(ms->cParams.minMatch)
    {
    default : /* includes case 3 */
    case 4 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 4, ZSTD_noDict);
    case 5 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 5, ZSTD_noDict);
    case 7 :
    case 6 : return ZSTD_HcFindBestMatch_generic(ms, ip, iLimit, offsetPtr, 6, ZSTD_noDict);
    }
}